

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool cs_impl::file_system::mkdir_p(string *path)

{
  initializer_list<char> iVar1;
  initializer_list<char> iVar2;
  long lVar3;
  char *pcVar4;
  ulong in_RDI;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  size_t in_stack_fffffffffffffef8;
  flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff00;
  flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  size_type in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  key_equal local_6d [3];
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 *local_68;
  undefined8 local_60;
  ulong local_10;
  byte local_1;
  
  local_10 = in_RDI;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
LAB_0051d113:
    uVar5 = 0x2f;
    uVar6 = 0x5c;
    this = (flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff23;
    std::allocator<char>::allocator();
    iVar2._M_array._7_1_ = in_stack_ffffffffffffff0f;
    iVar2._M_array._0_7_ = in_stack_ffffffffffffff08;
    iVar2._M_len = in_stack_ffffffffffffff10;
    phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
    raw_hash_set(this,iVar2,local_10,
                 (hasher *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (key_equal *)this,
                 (allocator_type *)CONCAT17(uVar6,CONCAT16(uVar5,in_stack_ffffffffffffff20)));
    cs_system_impl::split
              ((string *)in_stack_ffffffffffffff68,
               (set_t<char> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_1 = cs_system_impl::mkdir_dirs
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
    ~flat_hash_set((flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                    *)0x51d1d2);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff23);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar4 != '/') {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar4 != '\\') goto LAB_0051d113;
    }
    local_6a = 0x2f;
    local_69 = 0x5c;
    local_68 = &local_6a;
    local_60 = 2;
    std::allocator<char>::allocator();
    iVar1._M_array._7_1_ = in_stack_ffffffffffffff0f;
    iVar1._M_array._0_7_ = in_stack_ffffffffffffff08;
    iVar1._M_len = local_10;
    phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
    raw_hash_set(in_stack_ffffffffffffff00,iVar1,in_stack_fffffffffffffef8,
                 (hasher *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),local_6d,
                 (allocator_type *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    cs_system_impl::split
              ((string *)in_stack_ffffffffffffff68,
               (set_t<char> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_1 = cs_system_impl::mkdir_dirs
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff00);
    phmap::flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>::
    ~flat_hash_set((flat_hash_set<char,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                    *)0x51d095);
    std::allocator<char>::~allocator((allocator<char> *)local_6d);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool mkdir_p(const std::string &path)
		{
			if (path.size() > 0 && (path[0] == '/' || path[0] == '\\'))
				return cs_system_impl::mkdir_dirs(cs_system_impl::split(path, {'/', '\\'}), 0755, true);
			else
				return cs_system_impl::mkdir_dirs(cs_system_impl::split(path, {'/', '\\'}), 0755, false);
		}